

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

int ConvertStringToInt08(char *szString,PDWORD PtrValue)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  
  bVar1 = AsciiToUpperTable_BkSlash[*szString] - 0x30;
  if (9 < bVar1) {
    bVar1 = AsciiToUpperTable_BkSlash[*szString] - 0x37;
  }
  bVar2 = AsciiToUpperTable_BkSlash[szString[1]] - 0x30;
  if (9 < bVar2) {
    bVar2 = AsciiToUpperTable_BkSlash[szString[1]] - 0x37;
  }
  *PtrValue = (uint)bVar2 | (uint)bVar1 << 4;
  iVar3 = 0;
  if (0xf < bVar2) {
    iVar3 = 1000;
  }
  if (0xf < bVar1) {
    iVar3 = 1000;
  }
  return iVar3;
}

Assistant:

int ConvertStringToInt08(const char * szString, PDWORD PtrValue)
{
    BYTE DigitOne = AsciiToUpperTable_BkSlash[szString[0]] - '0';
    BYTE DigitTwo = AsciiToUpperTable_BkSlash[szString[1]] - '0';

    // Fix the digits
    if(DigitOne > 9)
        DigitOne -= 'A' - '9' - 1;
    if(DigitTwo > 9)
        DigitTwo -= 'A' - '9' - 1;

    // Combine them into a value
    PtrValue[0] = (DigitOne << 0x04) | DigitTwo;
    return (DigitOne <= 0x0F && DigitTwo <= 0x0F) ? ERROR_SUCCESS : ERROR_BAD_FORMAT;
}